

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O0

int psa_is_key_id_valid(psa_key_file_id_t file_id,int vendor_ok)

{
  psa_app_key_id_t key_id;
  int vendor_ok_local;
  psa_key_file_id_t file_id_local;
  
  if ((file_id == 0) || (0x3fffffff < file_id)) {
    if ((vendor_ok == 0) || ((file_id < 0x40000000 || (0x7fffffff < file_id)))) {
      vendor_ok_local = 0;
    }
    else {
      vendor_ok_local = 1;
    }
  }
  else {
    vendor_ok_local = 1;
  }
  return vendor_ok_local;
}

Assistant:

static int psa_is_key_id_valid( psa_key_file_id_t file_id,
                                int vendor_ok )
{
    psa_app_key_id_t key_id = PSA_KEY_FILE_GET_KEY_ID( file_id );
    if( PSA_KEY_ID_USER_MIN <= key_id && key_id <= PSA_KEY_ID_USER_MAX )
        return( 1 );
    else if( vendor_ok &&
             PSA_KEY_ID_VENDOR_MIN <= key_id &&
             key_id <= PSA_KEY_ID_VENDOR_MAX )
        return( 1 );
    else
        return( 0 );
}